

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

Hash Fossilize::Hashing::compute_hash_physical_device_features(void *device_pnext)

{
  uint uVar1;
  bool bVar2;
  int *piVar3;
  uint *puVar4;
  Hash HVar5;
  size_type local_58;
  string local_50;
  
  for (piVar3 = (int *)device_pnext; piVar3 != (int *)0x0; piVar3 = *(int **)(piVar3 + 2)) {
    if (*piVar3 == 0x3b9bb078) goto LAB_001186ce;
  }
  piVar3 = (int *)0x0;
LAB_001186ce:
  HVar5 = 0xaf63bd4c8601b7df;
  if (piVar3 != (int *)0x0) {
    HVar5 = (ulong)(uint)piVar3[4] ^ 0xaf63bd4c8601b7df;
  }
  do {
    device_pnext = pnext_chain_pdf2_skip_ignored_entries(device_pnext);
    if ((uint *)device_pnext == (uint *)0x0) {
      return HVar5;
    }
    uVar1 = *device_pnext;
    HVar5 = HVar5 * 0x100000001b3 ^ (ulong)uVar1;
    if ((int)uVar1 < 0x3b9fcb40) {
      if ((int)uVar1 < 0x3b9f2730) {
        if (uVar1 != 0x3b9ddf10) {
          if (uVar1 != 0x3b9e3cd3) goto LAB_0011885a;
          goto LAB_00118785;
        }
LAB_001187bd:
        uVar1 = *(uint *)((long)device_pnext + 0x10);
      }
      else {
        if (uVar1 == 0x3b9f2730) {
LAB_00118785:
          HVar5 = (HVar5 * 0x100000001b3 ^ (ulong)*(uint *)((long)device_pnext + 0x10)) *
                  0x100000001b3 ^ (ulong)*(uint *)((long)device_pnext + 0x14);
          puVar4 = (uint *)((long)device_pnext + 0x18);
          goto LAB_00118815;
        }
        if (uVar1 == 0x3b9f9c62) {
          HVar5 = ((HVar5 * 0x100000001b3 ^ (ulong)*(uint *)((long)device_pnext + 0x10)) *
                   0x100000001b3 ^ (ulong)*(uint *)((long)device_pnext + 0x14)) * 0x100000001b3 ^
                  (ulong)*(uint *)((long)device_pnext + 0x18);
          puVar4 = (uint *)((long)device_pnext + 0x1c);
          goto LAB_00118815;
        }
        if (uVar1 != 0x3b9fc371) goto LAB_0011885a;
        uVar1 = *(uint *)((long)device_pnext + 0x10);
        HVar5 = HVar5 * 0x100000001b3 ^ (ulong)*(uint *)((long)device_pnext + 0x18);
      }
      HVar5 = HVar5 * 0x100000001b3 ^ (ulong)uVar1;
LAB_0011880e:
      puVar4 = (uint *)((long)device_pnext + 0x14);
LAB_00118815:
      HVar5 = HVar5 * 0x100000001b3 ^ (ulong)*puVar4;
      device_pnext = *(void **)((long)device_pnext + 8);
      bVar2 = true;
    }
    else {
      if ((int)uVar1 < 0x3ba09e30) {
        if (uVar1 == 0x3b9fcb40) {
          HVar5 = (((HVar5 * 0x100000001b3 ^ (ulong)*(uint *)((long)device_pnext + 0x10)) *
                    0x100000001b3 ^ (ulong)*(uint *)((long)device_pnext + 0x14)) * 0x100000001b3 ^
                  (ulong)*(uint *)((long)device_pnext + 0x18)) * 0x100000001b3 ^
                  (ulong)*(uint *)((long)device_pnext + 0x1c);
          puVar4 = (uint *)((long)device_pnext + 0x20);
        }
        else {
          if (uVar1 != 0x3b9fe698) goto LAB_0011885a;
LAB_001187b4:
          puVar4 = (uint *)((long)device_pnext + 0x10);
        }
        goto LAB_00118815;
      }
      if (uVar1 == 0x3ba09e30) {
        HVar5 = (HVar5 * 0x100000001b3 ^ (ulong)*(uint *)((long)device_pnext + 0x10)) *
                0x100000001b3 ^ (ulong)*(uint *)((long)device_pnext + 0x18);
        goto LAB_0011880e;
      }
      if (uVar1 == 0x3ba0c928) goto LAB_001187bd;
      if (uVar1 == 0x3ba224d0) goto LAB_001187b4;
LAB_0011885a:
      local_58 = 0x25;
      bVar2 = false;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_58);
      local_50.field_2._M_allocated_capacity = local_58;
      builtin_strncpy(local_50._M_dataplus._M_p,"Unsupported pNext found, cannot hash.",0x25);
      local_50._M_string_length = local_58;
      local_50._M_dataplus._M_p[local_58] = '\0';
      log_error_pnext_chain(&local_50,device_pnext);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        bVar2 = false;
      }
    }
    if (!bVar2) {
      return HVar5;
    }
  } while( true );
}

Assistant:

static Hash compute_hash_physical_device_features(const void *device_pnext)
{
	Hasher h;

	// For hash invariance, make sure we hash PDF2 first, since when we serialize and unserialize,
	// PDF2 will always come first in the chain.
	auto *pdf2 = find_pnext<VkPhysicalDeviceFeatures2>(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2, device_pnext);
	if (pdf2)
		h.u32(pdf2->features.robustBufferAccess);
	else
		h.u32(0);

	hash_pnext_chain_pdf2(nullptr, h, device_pnext);
	return h.get();
}